

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O0

void __thiscall
CDoodadsMapper::PlaceDoodads
          (CDoodadsMapper *this,CLayerTiles *pLayer,CRule *pRule,
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          *pPositions,int Amount,int LeftWall)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  array<int,_allocator_default<int>_> *paVar6;
  int *piVar7;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *in_RCX;
  undefined4 *in_RDX;
  long in_RSI;
  int in_R8D;
  uint in_R9D;
  long in_FS_OFFSET;
  int j_1;
  int Size;
  int j;
  int Index_4;
  int x_4;
  int y_4;
  int CheckIndex_1;
  int Index_3;
  int x_3;
  int y_3;
  int Index_2;
  int x_2;
  int y_2;
  int CheckIndex;
  int Index_1;
  int x_1;
  int y_1;
  int Index;
  int x;
  int y;
  int ID;
  int c;
  int f;
  int RandomValue;
  int MaxIndex;
  array<int,_allocator_default<int>_> aChainAfter;
  array<int,_allocator_default<int>_> aChainBefore;
  CTile Tmp_1;
  CTile Tmp;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_ac;
  int local_a8;
  int local_9c;
  int local_98;
  int local_90;
  int local_8c;
  int local_80;
  int local_7c;
  int local_74;
  int local_70;
  int local_68;
  int local_64;
  int local_60;
  array<int,_allocator_default<int>_> local_30;
  array<int,_allocator_default<int>_> local_20;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX[6] == 1) {
    in_RDX[5] = in_RDX[5] + 1;
  }
  else if (in_RDX[6] == 2) {
    in_RDX[4] = in_RDX[4] + 1;
  }
  if (in_R9D != 0) {
    in_RDX[8] = in_R9D ^ in_RDX[8];
    in_RDX[4] = in_RDX[4] + -1;
    in_RDX[4] = -in_RDX[4];
    in_RDX[4] = in_RDX[4] - (in_RDX[2] + -1);
  }
  iVar2 = *(int *)(in_RSI + 0x34) * *(int *)(in_RSI + 0x38);
  local_60 = (int)((float)(int)in_RDX[7] * ((101.0 - (float)in_R8D) / 100.0));
  if (in_RDX[7] == 1) {
    local_60 = 1;
  }
  if ((1 < (int)in_RDX[7]) && (local_60 < 2)) {
    local_60 = 2;
  }
  local_64 = 0;
  do {
    iVar3 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::size(in_RCX);
    if (iVar3 <= local_64) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    local_68 = 0;
    while( true ) {
      paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
               ::operator[](in_RCX,local_64);
      iVar3 = array<int,_allocator_default<int>_>::size(paVar6);
      if (iVar3 <= local_68) break;
      if ((in_RDX[6] == 0) || (in_RDX[6] == 1)) {
        paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                 ::operator[](in_RCX,local_64);
        iVar3 = array<int,_allocator_default<int>_>::size(paVar6);
        if (iVar3 - local_68 < (int)in_RDX[2]) break;
      }
      if (in_RDX[6] == 2) {
        paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                 ::operator[](in_RCX,local_64);
        iVar3 = array<int,_allocator_default<int>_>::size(paVar6);
        if (iVar3 - local_68 < (int)in_RDX[3]) break;
      }
      if ((local_60 < 2) || (bVar1 = IAutoMapper::Random(0), bVar1)) {
        paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                 ::operator[](in_RCX,local_64);
        piVar7 = array<int,_allocator_default<int>_>::operator[](paVar6,local_68);
        iVar3 = in_RDX[5] * *(int *)(in_RSI + 0x34) + in_RDX[4] + *piVar7;
        for (local_70 = 0; local_70 < (int)in_RDX[3]; local_70 = local_70 + 1) {
          for (local_74 = 0; local_74 < (int)in_RDX[2]; local_74 = local_74 + 1) {
            iVar4 = local_70 * *(int *)(in_RSI + 0x34) + local_74 + iVar3;
            if ((0 < iVar4) && (iVar4 < iVar2)) {
              *(char *)(*(long *)(in_RSI + 0x68) + (long)iVar4 * 4) =
                   (char)*in_RDX + (char)(local_70 << 4) + (char)local_74;
            }
          }
        }
        if (in_RDX[8] != 0) {
          for (local_7c = 0; local_7c < (int)in_RDX[3]; local_7c = local_7c + 1) {
            for (local_80 = 0; local_80 < (int)in_RDX[2] / 2; local_80 = local_80 + 1) {
              iVar4 = local_7c * *(int *)(in_RSI + 0x34) + local_80 + iVar3;
              if ((((0 < iVar4) && (iVar4 < iVar2)) &&
                  (iVar5 = iVar4 + in_RDX[2] + -1 + local_80 * -2, 0 < iVar5)) && (iVar5 < iVar2)) {
                local_c = *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar4 * 4);
                *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar4 * 4) =
                     *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar5 * 4);
                *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar5 * 4) = local_c;
              }
            }
          }
          for (local_8c = 0; local_8c < (int)in_RDX[3]; local_8c = local_8c + 1) {
            for (local_90 = 0; local_90 < (int)in_RDX[2]; local_90 = local_90 + 1) {
              iVar4 = local_8c * *(int *)(in_RSI + 0x34) + local_90 + iVar3;
              if ((0 < iVar4) && (iVar4 < iVar2)) {
                *(byte *)(*(long *)(in_RSI + 0x68) + 1 + (long)iVar4 * 4) =
                     *(byte *)(*(long *)(in_RSI + 0x68) + 1 + (long)iVar4 * 4) ^ 1;
              }
            }
          }
        }
        if (in_RDX[9] != 0) {
          for (local_98 = 0; local_98 < (int)in_RDX[3] / 2; local_98 = local_98 + 1) {
            for (local_9c = 0; local_9c < (int)in_RDX[2]; local_9c = local_9c + 1) {
              iVar4 = local_98 * *(int *)(in_RSI + 0x34) + local_9c + iVar3;
              if (((0 < iVar4) && (iVar4 < iVar2)) &&
                 ((iVar5 = iVar4 + (in_RDX[3] + -1 + local_98 * -2) * *(int *)(in_RSI + 0x34),
                  0 < iVar5 && (iVar5 < iVar2)))) {
                local_10 = *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar4 * 4);
                *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar4 * 4) =
                     *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar5 * 4);
                *(undefined4 *)(*(long *)(in_RSI + 0x68) + (long)iVar5 * 4) = local_10;
              }
            }
          }
          for (local_a8 = 0; local_a8 < (int)in_RDX[3]; local_a8 = local_a8 + 1) {
            for (local_ac = 0; local_ac < (int)in_RDX[2]; local_ac = local_ac + 1) {
              iVar4 = local_a8 * *(int *)(in_RSI + 0x34) + local_ac + iVar3;
              if ((0 < iVar4) && (iVar4 < iVar2)) {
                *(byte *)(*(long *)(in_RSI + 0x68) + 1 + (long)iVar4 * 4) =
                     *(byte *)(*(long *)(in_RSI + 0x68) + 1 + (long)iVar4 * 4) ^ 2;
              }
            }
          }
        }
        if (1 < local_60) {
          array<int,_allocator_default<int>_>::array
                    ((array<int,_allocator_default<int>_> *)0x1e4acb);
          array<int,_allocator_default<int>_>::array
                    ((array<int,_allocator_default<int>_> *)0x1e4ad8);
          for (local_c0 = 0; local_c0 < local_68; local_c0 = local_c0 + 1) {
            paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                     ::operator[](in_RCX,local_64);
            array<int,_allocator_default<int>_>::operator[](paVar6,local_c0);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          }
          local_c4 = in_RDX[2];
          if (in_RDX[6] == 2) {
            local_c4 = in_RDX[3];
          }
          local_c8 = local_68 + local_c4;
          while( true ) {
            paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                     ::operator[](in_RCX,local_64);
            iVar3 = array<int,_allocator_default<int>_>::size(paVar6);
            if (iVar3 <= local_c8) break;
            paVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                     ::operator[](in_RCX,local_64);
            array<int,_allocator_default<int>_>::operator[](paVar6,local_c8);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            local_c8 = local_c8 + 1;
          }
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          ::remove_index((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffeec);
          local_68 = -1;
          in_stack_fffffffffffffef4 = array<int,_allocator_default<int>_>::size(&local_20);
          if (1 < in_stack_fffffffffffffef4) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::add((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (array<int,_allocator_default<int>_> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          }
          in_stack_fffffffffffffef0 = array<int,_allocator_default<int>_>::size(&local_30);
          if (1 < in_stack_fffffffffffffef0) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::add((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (array<int,_allocator_default<int>_> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          }
          array<int,_allocator_default<int>_>::~array
                    ((array<int,_allocator_default<int>_> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          array<int,_allocator_default<int>_>::~array
                    ((array<int,_allocator_default<int>_> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        }
      }
      local_68 = in_RDX[2] + local_68;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

void CDoodadsMapper::PlaceDoodads(CLayerTiles *pLayer, CRule *pRule, array<array<int> > *pPositions, int Amount, int LeftWall)
{
	if(pRule->m_Location == CRule::CEILING)
		pRule->m_RelativePos.y++;
	else if(pRule->m_Location == CRule::WALLS)
		pRule->m_RelativePos.x++;

	// left walls
	if(LeftWall)
	{
		pRule->m_HFlip ^= LeftWall;
		pRule->m_RelativePos.x--;
		pRule->m_RelativePos.x = -pRule->m_RelativePos.x;
		pRule->m_RelativePos.x -= pRule->m_Size.x-1;
	}

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	int RandomValue = pRule->m_Random*((101.f-Amount)/100.0f);

	if(pRule->m_Random == 1)
		RandomValue = 1;

	// allow diversity with high Amount
	if(pRule->m_Random > 1 && RandomValue <= 1)
		RandomValue = 2;

	for(int f = 0; f < pPositions->size(); f++)
		for(int c = 0; c < (*pPositions)[f].size(); c += pRule->m_Size.x)
		{
			if((pRule->m_Location == CRule::FLOOR || pRule->m_Location == CRule::CEILING)
				&& (*pPositions)[f].size()-c < pRule->m_Size.x)
			break;

			if(pRule->m_Location == CRule::WALLS && (*pPositions)[f].size()-c < pRule->m_Size.y)
				break;

			if(RandomValue > 1 && !IAutoMapper::Random(RandomValue))
				continue;

			// where to put it
			int ID = (*pPositions)[f][c];

			// relative position
			ID += pRule->m_RelativePos.x;
			ID += pRule->m_RelativePos.y*pLayer->m_Width;

			for(int y = 0; y < pRule->m_Size.y; y++)
				for(int x = 0; x < pRule->m_Size.x; x++)
				{
					int Index = y*pLayer->m_Width+x+ID;
					if(Index <= 0 || Index >= MaxIndex)
						continue;

					pLayer->m_pTiles[Index].m_Index = pRule->m_Rect.x+y*16+x;
				}

			// hflip
			if(pRule->m_HFlip)
			{
				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x/2; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+pRule->m_Size.x-1-x*2;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_VFLIP;
					}
			}

			// vflip
			if(pRule->m_VFlip)
			{
				for(int y = 0; y < pRule->m_Size.y/2; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+(pRule->m_Size.y-1-y*2)*pLayer->m_Width;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_HFLIP;
					}
			}

			// make the place occupied
			if(RandomValue > 1)
			{
				array<int> aChainBefore;
				array<int> aChainAfter;

				for(int j = 0; j < c; j++)
					aChainBefore.add((*pPositions)[f][j]);

				int Size = pRule->m_Size.x;
				if(pRule->m_Location == CRule::WALLS)
					Size = pRule->m_Size.y;

				for(int j = c+Size; j < (*pPositions)[f].size(); j++)
					aChainAfter.add((*pPositions)[f][j]);

				pPositions->remove_index(f);

				// f changes, reset c
				c = -1;

				if(aChainBefore.size() > 1)
					pPositions->add(aChainBefore);
				if(aChainAfter.size() > 1)
					pPositions->add(aChainAfter);
			}
		}
}